

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O3

URegistryKey icu_63::NumberFormat::registerFactory(NumberFormatFactory *toAdopt,UErrorCode *status)

{
  int iVar1;
  ICULocaleService *pIVar2;
  LocaleKeyFactory *this;
  undefined4 extraout_var;
  UErrorCode *size;
  
  size = status;
  pIVar2 = getNumberFormatService();
  if (pIVar2 != (ICULocaleService *)0x0) {
    this = (LocaleKeyFactory *)UMemory::operator_new((UMemory *)0x60,(size_t)size);
    if (this != (LocaleKeyFactory *)0x0) {
      iVar1 = (*(toAdopt->super_UObject)._vptr_UObject[3])(toAdopt);
      LocaleKeyFactory::LocaleKeyFactory(this,(uint)((char)iVar1 == '\0'));
      (this->super_ICUServiceFactory).super_UObject._vptr_UObject =
           (_func_int **)&PTR__NFFactory_003edc70;
      this[1].super_ICUServiceFactory.super_UObject._vptr_UObject = (_func_int **)toAdopt;
      this[1]._name.super_Replaceable.super_UObject._vptr_UObject = (_func_int **)0x0;
      iVar1 = (*(pIVar2->super_ICUService).super_ICUNotifier._vptr_ICUNotifier[9])
                        (pIVar2,this,status);
      return (URegistryKey)CONCAT44(extraout_var,iVar1);
    }
  }
  *status = U_MEMORY_ALLOCATION_ERROR;
  return (URegistryKey)0x0;
}

Assistant:

URegistryKey U_EXPORT2
NumberFormat::registerFactory(NumberFormatFactory* toAdopt, UErrorCode& status)
{
  ICULocaleService *service = getNumberFormatService();
  if (service) {
	  NFFactory *tempnnf = new NFFactory(toAdopt);
	  if (tempnnf != NULL) {
		  return service->registerFactory(tempnnf, status);
	  }
  }
  status = U_MEMORY_ALLOCATION_ERROR;
  return NULL;
}